

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utOgreImportExport.cpp
# Opt level: O0

void __thiscall
utOgreImportExport_importerTest_Test::TestBody(utOgreImportExport_importerTest_Test *this)

{
  bool bVar1;
  int iVar2;
  char *message;
  char *in_R9;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  utOgreImportExport_importerTest_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  iVar2 = (*(this->super_utOgreImportExport).super_AbstractImportExportBase.super_Test._vptr_Test[6]
          )();
  local_21 = SUB41(iVar2,0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_20,(AssertionResult *)"importerTest()","false","true",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/ImportExport/utOgreImportExport.cpp"
               ,0x3f,message);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST_F(utOgreImportExport, importerTest ) {
    EXPECT_TRUE(importerTest());
}